

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O3

string * BuildRelativeOutputPath(string *__return_storage_ptr__,char **argv,string *inRelativeURL)

{
  string *extraout_RAX;
  string *psVar1;
  allocator<char> local_59;
  undefined1 local_58 [32];
  FileURL local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,(char *)argv,&local_59);
  LocalPathToFileURL(&local_38,(string *)local_58);
  RelativeURLToLocalPath(__return_storage_ptr__,&local_38,inRelativeURL);
  FileURL::~FileURL(&local_38);
  psVar1 = (string *)(local_58 + 0x10);
  if ((string *)local_58._0_8_ != psVar1) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

static string BuildRelativeOutputPath(char* argv[], const string& inRelativeURL)
{
    return RelativeURLToLocalPath(LocalPathToFileURL(argv[2]), inRelativeURL);
}